

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_init_gnss_bds_const(fsnav_bds_const *bds_const)

{
  double dVar1;
  
  bds_const->mu = 398600441800000.0;
  bds_const->u = 7.292115e-05;
  bds_const->a = 6378137.0;
  bds_const->e2 = 0.0066943800229008;
  bds_const->F = -4.442807309043977e-10;
  bds_const->leap_sec = 14.0;
  bds_const->B1 = 1561098000.0;
  dVar1 = (fsnav->gnss_const).c;
  bds_const->L1 = dVar1 / 1561098000.0;
  bds_const->B2 = 1207140000.0;
  bds_const->L2 = dVar1 / 1207140000.0;
  return;
}

Assistant:

void fsnav_init_gnss_bds_const(fsnav_bds_const* bds_const)
{
	bds_const->mu       =  3.986004418e14;                   // Earth gravity constant as in BeiDou SIS ICD OSS Version 2.1 (November 2016), m^3/s^2
	bds_const->u        =  7.292115e-5;                      // Earth rotation rate as in BeiDou SIS ICD OSS Version 2.1 (November 2016), rad/s
	bds_const->a        =  6378137.0;                        // Earth ellipsoid semi-major axis as in BeiDou SIS ICD OSS Version 2.1 (November 2016), m
	bds_const->e2       =  6.6943800229008e-3;               // Earth ellipsoid first eccentricity squared derived from flattening as in BeiDou SIS ICD OSS Version 2.1 (November 2016)
	bds_const->F        = -4.442807309043977e-10;            // relativistic correction constant derived from Earth gravity as in BeiDou SIS ICD OSS Version 2.1 (November 2016), s/sqrt(m)
	bds_const->leap_sec =  14;                               // leap seconds between BeiDou time and GPS time as of 01-Jan-2006
	bds_const->B1       =  1561.098e6;                       // nominal frequency for B1 signal as in BeiDou SIS ICD OSS Version 2.1 (November 2016)
	bds_const->L1       =  fsnav->gnss_const.c/bds_const->B1; // nominal wavelength for B1 signal
	bds_const->B2       =  1207.140e6;                       // nominal frequency for B2 signal as in BeiDou SIS ICD OSS Version 2.1 (November 2016)
	bds_const->L2       =  fsnav->gnss_const.c/bds_const->B2; // nominal wavelength for B2 signal
}